

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O0

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_from_sin
          (PolarExtentCoreSimd<xsimd::avx512bw> *this,PolarExtentCoreContext *ctx,batch sin_angle)

{
  bool bVar1;
  batch *extraout_RAX;
  batch *extraout_RAX_00;
  batch *pbVar2;
  batch<float,_xsimd::avx512bw> ramp;
  batch_bool<float,_xsimd::avx512bw> end;
  batch_bool<float,_xsimd::avx512bw> start;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffc20;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffc28;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc9c;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffca0;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffca8;
  batch<float,_xsimd::avx512bw> *in_stack_fffffffffffffcb0;
  batch<float,_xsimd::avx512bw> local_200;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_182;
  batch<float,_xsimd::avx512bw> local_180;
  get_bool_simd_register_t<float,_xsimd::avx512bw> local_112 [9];
  batch<float,_xsimd::avx512bw> local_100 [3];
  
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  local_112[0].data = (register_type)xsimd::operator<=(local_100,&local_180);
  xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
  local_182.data = (register_type)xsimd::operator>=(local_100,&local_200);
  bVar1 = xsimd::all<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)local_112);
  if (bVar1) {
    xsimd::batch<float,_xsimd::avx512bw>::batch(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c)
    ;
    pbVar2 = extraout_RAX;
  }
  else {
    bVar1 = xsimd::all<float,xsimd::avx512bw>((batch_bool<float,_xsimd::avx512bw> *)&local_182);
    if (bVar1) {
      xsimd::batch<float,_xsimd::avx512bw>::batch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      pbVar2 = extraout_RAX_00;
    }
    else {
      xsimd::batch<float,_xsimd::avx512bw>::batch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      xsimd::asin<float,xsimd::avx512bw>(in_stack_fffffffffffffc30);
      xsimd::operator*(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      xsimd::batch<float,_xsimd::avx512bw>::batch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      xsimd::operator+(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      xsimd::batch<float,_xsimd::avx512bw>::batch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      xsimd::batch<float,_xsimd::avx512bw>::batch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      xsimd::select<float,xsimd::avx512bw>
                ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffc30,
                 in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      pbVar2 = xsimd::select<float,xsimd::avx512bw>
                         ((batch_bool<float,_xsimd::avx512bw> *)in_stack_fffffffffffffc30,
                          in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    }
  }
  return pbVar2;
}

Assistant:

batch weight_from_sin(PolarExtentCoreContext &ctx, batch sin_angle) const {
      auto start = sin_angle <= ctx.sin_start_angle;
      auto end = sin_angle >= ctx.sin_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::asin(sin_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }